

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7enc.c
# Opt level: O0

uint64_t pack_mode1_to_one_color
                   (color_cell_compressor_params *pParams,color_cell_compressor_results *pResults,
                   uint32_t r,uint32_t g,uint32_t b,uint8_t *pSelectors)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  uint in_ECX;
  uint in_EDX;
  uint64_t *in_RSI;
  uint *in_RDI;
  uint in_R8D;
  void *in_R9;
  uint32_t i_1;
  uint64_t total_err;
  uint32_t high;
  uint32_t low;
  uint32_t i;
  color_quad_u8 p;
  endpoint_err *pEb;
  endpoint_err *pEg;
  endpoint_err *pEr;
  uint32_t err;
  uint32_t p_1;
  uint32_t best_p;
  uint32_t best_err;
  uint local_6c;
  uint64_t local_68;
  uint local_58;
  color_quad_u8 local_54;
  endpoint_err *local_50;
  endpoint_err *local_48;
  endpoint_err *local_40;
  uint local_38;
  uint local_34;
  uint local_30;
  uint local_2c;
  void *local_28;
  uint64_t *local_10;
  uint *local_8;
  
  local_2c = 0xffffffff;
  local_30 = 0;
  local_34 = 0;
  while ((local_34 < 2 &&
         ((local_38 = (uint)g_bc7_mode_1_optimal_endpoints[in_EDX][local_34].m_error +
                      (uint)g_bc7_mode_1_optimal_endpoints[in_ECX][local_34].m_error +
                      (uint)g_bc7_mode_1_optimal_endpoints[in_R8D][local_34].m_error,
          local_2c <= local_38 || (local_30 = local_34, local_2c = local_38, local_38 != 0))))) {
    local_34 = local_34 + 1;
  }
  local_40 = g_bc7_mode_1_optimal_endpoints[in_EDX] + local_30;
  local_48 = g_bc7_mode_1_optimal_endpoints[in_ECX] + local_30;
  local_50 = g_bc7_mode_1_optimal_endpoints[in_R8D] + local_30;
  local_28 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  color_quad_u8_set((color_quad_u8 *)(in_RSI + 1),(uint)local_40->m_lo,(uint)local_48->m_lo,
                    (uint)local_50->m_lo,0);
  color_quad_u8_set((color_quad_u8 *)((long)local_10 + 0xc),(uint)local_40->m_hi,
                    (uint)local_48->m_hi,(uint)local_50->m_hi,0);
  *(uint *)(local_10 + 2) = local_30;
  *(undefined4 *)((long)local_10 + 0x14) = 0;
  memset(local_28,2,(ulong)*local_8);
  for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
    uVar1 = ((uint)*(byte *)((long)local_10 + (ulong)local_58 + 8) << 1 | (uint)local_10[2]) << 1;
    uVar2 = ((uint)*(byte *)((long)local_10 + (ulong)local_58 + 0xc) << 1 | (uint)local_10[2]) << 1;
    local_54.m_c[local_58] =
         (uint8_t)((uVar1 >> 7 | uVar1) * 0x2e + (uVar2 >> 7 | uVar2) * 0x12 + 0x20 >> 6);
  }
  local_54.m_c[3] = 0xff;
  local_68 = 0;
  for (local_6c = 0; local_6c < *local_8; local_6c = local_6c + 1) {
    uVar3 = compute_color_distance_rgb
                      (&local_54,(color_quad_u8 *)(*(long *)(local_8 + 2) + (ulong)local_6c * 4),
                       *(bc7enc_bool *)((long)local_8 + 0x3f),local_8 + 0xb);
    local_68 = uVar3 + local_68;
  }
  *local_10 = local_68;
  return local_68;
}

Assistant:

static uint64_t pack_mode1_to_one_color(const color_cell_compressor_params *pParams, color_cell_compressor_results *pResults, uint32_t r, uint32_t g, uint32_t b, uint8_t *pSelectors)
{
	uint32_t best_err = UINT_MAX;
	uint32_t best_p = 0;

	for (uint32_t p = 0; p < 2; p++)
	{
		uint32_t err = g_bc7_mode_1_optimal_endpoints[r][p].m_error + g_bc7_mode_1_optimal_endpoints[g][p].m_error + g_bc7_mode_1_optimal_endpoints[b][p].m_error;
		if (err < best_err)
		{
			best_err = err;
			best_p = p;
			if (!best_err)
				break;
		}
	}

	const endpoint_err *pEr = &g_bc7_mode_1_optimal_endpoints[r][best_p];
	const endpoint_err *pEg = &g_bc7_mode_1_optimal_endpoints[g][best_p];
	const endpoint_err *pEb = &g_bc7_mode_1_optimal_endpoints[b][best_p];

	color_quad_u8_set(&pResults->m_low_endpoint, pEr->m_lo, pEg->m_lo, pEb->m_lo, 0);
	color_quad_u8_set(&pResults->m_high_endpoint, pEr->m_hi, pEg->m_hi, pEb->m_hi, 0);
	pResults->m_pbits[0] = best_p;
	pResults->m_pbits[1] = 0;

	memset(pSelectors, BC7ENC_MODE_1_OPTIMAL_INDEX, pParams->m_num_pixels);

	color_quad_u8 p;
	for (uint32_t i = 0; i < 3; i++)
	{
		uint32_t low = ((pResults->m_low_endpoint.m_c[i] << 1) | pResults->m_pbits[0]) << 1;
		low |= (low >> 7);

		uint32_t high = ((pResults->m_high_endpoint.m_c[i] << 1) | pResults->m_pbits[0]) << 1;
		high |= (high >> 7);

		p.m_c[i] = (uint8_t)((low * (64 - g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX]) + high * g_bc7_weights3[BC7ENC_MODE_1_OPTIMAL_INDEX] + 32) >> 6);
	}
	p.m_c[3] = 255;

	uint64_t total_err = 0;
	for (uint32_t i = 0; i < pParams->m_num_pixels; i++)
		total_err += compute_color_distance_rgb(&p, &pParams->m_pPixels[i], pParams->m_perceptual, pParams->m_weights);

	pResults->m_best_overall_err = total_err;

	return total_err;
}